

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reduction.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeReduction(ConvertLayerParameters layerParameters)

{
  int iVar1;
  Rep *pRVar2;
  string *layerName;
  string *layerType;
  Type *pTVar3;
  NeuralNetworkLayer *this;
  ReduceLayerParams *pRVar4;
  void **ppvVar5;
  ReductionParameter *pRVar6;
  long lVar7;
  long lVar8;
  allocator local_b9;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                      *layerParameters.layerId);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (layerParameters.nnWrite);
  if (((pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
     ((pTVar3->top_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    lVar8 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_b8,"Must have 1 input and 1 output",(allocator *)&local_68);
    errorInCaffeProto(&local_b8,(pTVar3->name_).ptr_,(pTVar3->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_b8);
    lVar8 = (long)(pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar3->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar7 = 0; lVar8 * 8 != lVar7; lVar7 = lVar7 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&bottom,*(value_type **)((long)ppvVar5 + lVar7));
  }
  pRVar2 = (pTVar3->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  iVar1 = (pTVar3->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar8 = 0; (long)iVar1 * 8 != lVar8; lVar8 = lVar8 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&top,*(value_type **)((long)ppvVar5 + lVar8));
  }
  convertCaffeMetadata
            ((pTVar3->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  pRVar6 = pTVar3->reduction_param_;
  if (pRVar6 == (ReductionParameter *)0x0) {
    pRVar6 = (ReductionParameter *)&caffe::_ReductionParameter_default_instance_;
  }
  if (pRVar6->axis_ != 0) {
    std::__cxx11::string::string((string *)&local_b8,"axis",&local_b9);
    layerName = (pTVar3->name_).ptr_;
    layerType = (pTVar3->type_).ptr_;
    std::__cxx11::to_string(&local_68,pRVar6->axis_);
    unsupportedCaffeParrameterWithOption(&local_b8,layerName,layerType,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  pRVar4 = CoreML::Specification::NeuralNetworkLayer::mutable_reduce(this);
  switch(pRVar6->operation_) {
  case 1:
    pRVar4->mode_ = 0;
    break;
  case 2:
    pRVar4->mode_ = 5;
    break;
  case 3:
    pRVar4->mode_ = 4;
    break;
  case 4:
    pRVar4->mode_ = 1;
    break;
  default:
    std::__cxx11::string::string((string *)&local_b8,"operation not set",(allocator *)&local_68);
    errorInCaffeProto(&local_b8,(pTVar3->name_).ptr_,(pTVar3->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&top);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bottom);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeReduction(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ReductionParameter& caffeLayerParams = caffeLayer.reduction_param();
    
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.axis() != 0){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.axis()));
    }
    //***************************************************************
    
    Specification::ReduceLayerParams* specLayerParams = specLayer->mutable_reduce();
    switch(caffeLayerParams.operation()) {
        case caffe::ReductionParameter::ASUM:
            specLayerParams->set_mode(Specification::ReduceLayerParams::L1);
            break;
        case caffe::ReductionParameter::SUM:
            specLayerParams->set_mode(Specification::ReduceLayerParams::SUM);
            break;
        case caffe::ReductionParameter::SUMSQ:
            specLayerParams->set_mode(Specification::ReduceLayerParams::SUMSQUARE);
            break;
        case caffe::ReductionParameter::MEAN:
            specLayerParams->set_mode(Specification::ReduceLayerParams::AVG);
            break;
        default:
            CoreMLConverter::errorInCaffeProto("operation not set",caffeLayer.name(), caffeLayer.type());
    }
}